

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

char * __thiscall HttpResponse::getResponseString(HttpResponse *this)

{
  uint uVar1;
  int line;
  long lVar2;
  int level;
  char *fmt;
  ulong uVar3;
  
  uVar1 = this->mResponseCode;
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    fmt = "called after destruction with mResponseCode (%d)";
    level = 1;
    line = 0x68;
    uVar3 = 0xffffffff;
  }
  else {
    if (0xfffffe0b < uVar1 - 600) goto LAB_00119ca7;
    fmt = "unexpected mResponseCode (%d)";
    level = 0;
    line = 0x6c;
  }
  jh_log_print(level,"const char *HttpResponse::getResponseString() const",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
               ,line,fmt,uVar3);
LAB_00119ca7:
  lVar2 = 8;
  do {
    if (*(int *)(lVar2 + 0x131c78) == this->mResponseCode) {
      return *(char **)((long)&gResponseCodeList[0].code + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x278);
  return "Unknown HTTP error";
}

Assistant:

const char *HttpResponse::getResponseString() const
{
	if (mResponseCode == -1)
	{
		LOG_ERR_FATAL("called after destruction with mResponseCode (%d)",
					  mResponseCode);
	}
	else if (mResponseCode < 100 or mResponseCode > 599)
	{
		LOG_ERR("unexpected mResponseCode (%d)", mResponseCode);
	}

	return getResponseString( mResponseCode );
}